

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalStructuralDominance.cpp
# Opt level: O0

void wasm::LocalStructuralDominance::LocalStructuralDominance(wasm::Function*,wasm::Module&,wasm::
     LocalStructuralDominance::Mode)::Scanner::doLocalSet(Scanner*,wasm::Expression___
               (Scanner *self,Expression **currp)

{
  bool bVar1;
  LocalSet *pLVar2;
  reference this;
  reference local_40;
  reference local_30;
  uint local_1c;
  Expression **ppEStack_18;
  Index index;
  Expression **currp_local;
  Scanner *self_local;
  
  ppEStack_18 = currp;
  currp_local = (Expression **)self;
  pLVar2 = Expression::cast<wasm::LocalSet>(*currp);
  local_1c = pLVar2->index;
  local_30 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)(currp_local + 0x1c),(ulong)local_1c)
  ;
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_30);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_40 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)(currp_local + 0x1c),
                          (ulong)local_1c);
    std::_Bit_reference::operator=(&local_40,true);
    bVar1 = std::
            vector<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
            ::empty((vector<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
                     *)(currp_local + 0x21));
    if (!bVar1) {
      this = std::
             vector<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
             ::back((vector<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
                     *)(currp_local + 0x21));
      SmallVector<unsigned_int,_5UL>::push_back(this,&local_1c);
    }
  }
  return;
}

Assistant:

static void doLocalSet(Scanner* self, Expression** currp) {
      auto index = (*currp)->cast<LocalSet>()->index;
      if (!self->localsSet[index]) {
        // This local is now set until the end of this scope.
        self->localsSet[index] = true;
        // If we are not in the topmost scope, note this for later cleanup.
        if (!self->cleanupStack.empty()) {
          self->cleanupStack.back().push_back(index);
        }
      }
    }